

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall Qentem::Array<Qentem::Value<char>_>::Reset(Array<Qentem::Value<char>_> *this)

{
  Memory::Dispose<Qentem::Value<char>>(this->storage_,this->storage_ + this->index_);
  Memory::Deallocate(this->storage_);
  this->storage_ = (Value<char> *)0x0;
  this->index_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

void Reset() noexcept {
        Memory::Dispose(Storage(), End());
        Memory::Deallocate(Storage());

        clearStorage();
        setSize(0);
        setCapacity(0);
    }